

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int naBaseCategory(atom *a)

{
  char *pcVar1;
  int iVar2;
  char *__needle;
  ResidueAndAtomPair *pRVar3;
  
  iVar2 = 0x71;
  if ((~a->props & 0x2002U) == 0) {
    __needle = a->r->resname;
    pcVar1 = strstr(":  C:  G:  A:  T:  U:CYT:GUA:ADE:THY:URA:CTP:CDP:CMP:GTP:GDP:GMP:ATP:ADP:AMP:TTP:TDP:TMP:UTP:UDP:UMP:GSP:H2U:PSU:1MG:2MG:M2G:7MG:5MC:5MU:T6A:1MA:RIA:OMC:OMG: YG:  I: DA: DT: DC: DG: DI: AR: UR: TR: GR: CR:"
                    ,__needle);
    iVar2 = 0x70;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = ":  U:URA:UTP:UDP:UMP: UR:  T:THY:TTP:TDP:TMP:5MU: DT: TR:";
      pRVar3 = NAbaseGrouping;
      do {
        pRVar3 = pRVar3 + 1;
        pcVar1 = strstr(pcVar1,__needle);
        if (pcVar1 != (char *)0x0) {
          return pRVar3[-1].bits;
        }
        pcVar1 = pRVar3->rlist;
      } while (pcVar1 != (char *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int naBaseCategory(atom *a) {
   ResidueAndAtomPair *pair;

   if ((a->props & DNA_PROP) && (a->props & SC_PROP)) {
      if(strstr(NAList, a->r->resname)) {
         for (pair = NAbaseGrouping; pair->rlist; pair++){
	    if(strstr(pair->rlist, a->r->resname)) {
	       return pair->bits; /* bits contain the atom type */
	    }
         }
         return baseOther; /* not in table */
      }
     else return baseOther; /* not in list */
   }
   else return nonBase; /* backbone or not recognized as a nucleic acid */
}